

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_type.hpp
# Opt level: O3

void __thiscall
pstore::brokerface::message_type::
message_type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (message_type *this,uint32_t mid,uint16_t pno,uint16_t nump,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  ulong uVar1;
  unsigned_long __n2;
  size_t __n;
  payload_type *__dest;
  
  this->sender_id = process_id;
  this->message_id = mid;
  this->part_no = pno;
  this->num_parts = nump;
  __dest = &this->payload;
  uVar1 = (long)last._M_current - (long)first._M_current;
  if (0 < (long)uVar1) {
    __n = 0xf4;
    if (uVar1 < 0xf4) {
      __n = uVar1;
    }
    memcpy(__dest,first._M_current,__n);
    if (0xf3 < uVar1) goto LAB_0011dca4;
    __dest = (payload_type *)(__dest->_M_elems + __n);
  }
  memset(__dest,0,(long)this + (0x100 - (long)__dest));
  pno = this->part_no;
  nump = this->num_parts;
LAB_0011dca4:
  if (pno < nump) {
    return;
  }
  raise<pstore::error_code>(bad_message_part_number);
}

Assistant:

message_type (std::uint32_t const mid, std::uint16_t const pno,
                          std::uint16_t const nump, InputIterator first, InputIterator last)
                    : sender_id{process_id}
                    , message_id{mid}
                    , part_no{pno}
                    , num_parts{nump}
                    , payload (get_payload (first, last)) {

                if (part_no >= num_parts) {
                    raise (::pstore::error_code::bad_message_part_number);
                }
            }